

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

void x86ResetLabels(void)

{
  FastVector<unsigned_char_*,_false,_false>::reset(&labels);
  FastVector<UnsatisfiedJump,_false,_false>::reset(&pendingJumps);
  return;
}

Assistant:

void x86ResetLabels()
{
	labels.reset();
	pendingJumps.reset();
}